

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O1

int CVodeSetEtaMaxErrFail(void *cvode_mem,sunrealtype eta_max_ef)

{
  int iVar1;
  
  if (cvode_mem == (void *)0x0) {
    iVar1 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,0x24a,"CVodeSetEtaMaxErrFail",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_io.c"
                   ,"cvode_mem = NULL illegal.");
  }
  else {
    if ((eta_max_ef <= 0.0) || (1.0 <= eta_max_ef)) {
      *(undefined8 *)((long)cvode_mem + 0x338) = 0x3fc999999999999a;
    }
    else {
      *(sunrealtype *)((long)cvode_mem + 0x338) = eta_max_ef;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CVodeSetEtaMaxErrFail(void* cvode_mem, sunrealtype eta_max_ef)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  /* set allowed value or use default */
  if (eta_max_ef <= ZERO || eta_max_ef >= ONE)
  {
    cv_mem->cv_eta_max_ef = ETA_MAX_EF_DEFAULT;
  }
  else { cv_mem->cv_eta_max_ef = eta_max_ef; }

  return (CV_SUCCESS);
}